

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImGuiWindow_*>::push_back(ImVector<ImGuiWindow_*> *this,ImGuiWindow **v)

{
  int iVar1;
  int iVar2;
  int new_capacity;
  
  iVar2 = this->Size;
  if (iVar2 == this->Capacity) {
    if (iVar2 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar2 / 2 + iVar2;
    }
    new_capacity = iVar2 + 1;
    if (iVar2 + 1 < iVar1) {
      new_capacity = iVar1;
    }
    reserve(this,new_capacity);
    iVar2 = this->Size;
  }
  this->Data[iVar2] = *v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }